

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

tb_page_addr_t
get_page_addr_code_hostp_aarch64(CPUArchState_conflict1 *env,target_ulong addr,void **hostp)

{
  uc_struct_conflict2 *puVar1;
  TargetPageBits_conflict *pTVar2;
  ulong uVar3;
  _Bool _Var4;
  CPUTLBEntry *pCVar5;
  ram_addr_t rVar6;
  uint mmu_idx;
  ulong uVar7;
  ulong page;
  void *ptr;
  CPUARMState_conflict *__mptr;
  ulong mmu_idx_00;
  
  puVar1 = env->uc;
  mmu_idx = *(byte *)((long)&env->hflags + 3) & 0xf;
  mmu_idx_00 = (ulong)mmu_idx;
  pTVar2 = puVar1->init_target_page;
  pCVar5 = tlb_entry(env,mmu_idx_00,addr);
  uVar7 = *(ulong *)((long)&pCVar5->field_0 + 0x10);
  uVar3 = pTVar2->mask;
  page = uVar3 & addr;
  rVar6 = 0xffffffffffffffff;
  if (((uVar3 | 0x200) & uVar7) != page) {
    _Var4 = victim_tlb_hit(env,mmu_idx_00,
                           *(ulong *)((long)env + ((ulong)(mmu_idx << 4) - 0xd0)) >> 6 &
                           addr >> ((byte)pTVar2->bits & 0x3f),0x10,page);
    if (_Var4) {
      uVar7 = *(ulong *)((long)&pCVar5->field_0 + 0x10);
    }
    else {
      tlb_fill((CPUState *)(env[-4].vfp.zregs[0x17].d + 0x14),addr,0,MMU_INST_FETCH,mmu_idx,0);
      pCVar5 = tlb_entry(env,mmu_idx_00,addr);
      uVar7 = *(ulong *)((long)&pCVar5->field_0 + 0x10);
      if (((uint)uVar7 >> 9 & 1) != 0) {
        return 0xffffffffffffffff;
      }
    }
    uVar3 = puVar1->init_target_page->mask;
    if (((uVar3 | 0x200) & uVar7) != (uVar3 & addr)) {
      __assert_fail("tlb_hit(uc, entry->addr_code, addr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                    ,0x463,
                    "tb_page_addr_t get_page_addr_code_hostp_aarch64(CPUArchState *, target_ulong, void **)"
                   );
    }
  }
  if ((char)uVar7 < '\0') {
    if (hostp != (void **)0x0) {
      *hostp = (void *)0x0;
    }
  }
  else {
    ptr = (void *)(addr + (pCVar5->field_0).field_0.addend);
    if (hostp != (void **)0x0) {
      *hostp = ptr;
    }
    rVar6 = qemu_ram_addr_from_host_aarch64(env->uc,ptr);
    if (rVar6 == 0xffffffffffffffff) {
      abort();
    }
  }
  return rVar6;
}

Assistant:

tb_page_addr_t get_page_addr_code_hostp(CPUArchState *env, target_ulong addr,
                                        void **hostp)
{
    struct uc_struct *uc = env->uc;
    uintptr_t mmu_idx = cpu_mmu_index(env, true);
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    void *p;

    if (unlikely(!tlb_hit(uc, entry->addr_code, addr))) {
        if (!VICTIM_TLB_HIT(addr_code, addr)) {
            tlb_fill(env_cpu(env), addr, 0, MMU_INST_FETCH, mmu_idx, 0);
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);

            if (unlikely(entry->addr_code & TLB_INVALID_MASK)) {
                /*
                 * The MMU protection covers a smaller range than a target
                 * page, so we must redo the MMU check for every insn.
                 */
                return -1;
            }
        }
        assert(tlb_hit(uc, entry->addr_code, addr));
    }

    if (unlikely(entry->addr_code & TLB_MMIO)) {
        /* The region is not backed by RAM.  */
        if (hostp) {
            *hostp = NULL;
        }
        return -1;
    }

    p = (void *)((uintptr_t)addr + entry->addend);
    if (hostp) {
        *hostp = p;
    }
    return qemu_ram_addr_from_host_nofail(env->uc, p);
}